

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O2

int yy_get_next_buffer(void)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  YY_BUFFER_STATE pyVar9;
  YY_BUFFER_STATE *ppyVar10;
  size_t sVar11;
  
  pcVar1 = yytext;
  pcVar2 = yy_c_buf_p;
  sVar11 = yy_buffer_stack_top;
  ppyVar10 = yy_buffer_stack;
  pcVar3 = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
  if (pcVar3 + (long)yy_n_chars + 1 < yy_c_buf_p) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed");
  }
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_fill_buffer == 0) {
    return ((long)yy_c_buf_p - (long)yytext != 1) + 1;
  }
  lVar4 = 0;
  iVar8 = (int)(yy_c_buf_p + ~(ulong)yytext);
  uVar7 = 0;
  if (0 < iVar8) {
    uVar7 = (ulong)(yy_c_buf_p + ~(ulong)yytext) & 0xffffffff;
  }
  for (; (int)uVar7 != (int)lVar4; lVar4 = lVar4 + 1) {
    pcVar3[lVar4] = pcVar1[lVar4];
  }
  pyVar9 = ppyVar10[sVar11];
  if (pyVar9->yy_buffer_status != 2) {
    while (iVar5 = pyVar9->yy_buf_size, -2 < iVar8 - iVar5) {
      if (pyVar9->yy_is_our_buffer == 0) {
        pyVar9->yy_ch_buf = (char *)0x0;
LAB_0011c1b6:
        yy_fatal_error("fatal error - scanner input buffer overflow");
      }
      iVar6 = -((uint)-iVar5 >> 3);
      if (0 < iVar5) {
        iVar6 = iVar5;
      }
      pcVar3 = pyVar9->yy_ch_buf;
      pyVar9->yy_buf_size = iVar5 + iVar6;
      pcVar1 = (char *)realloc(pcVar3,(long)(iVar5 + iVar6 + 2));
      pyVar9->yy_ch_buf = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_0011c1b6;
      pcVar2 = pcVar1 + ((int)pcVar2 - (int)pcVar3);
      yy_c_buf_p = pcVar2;
      pyVar9 = ppyVar10[sVar11];
    }
    iVar5 = 0;
    iVar6 = Getc();
    sVar11 = yy_buffer_stack_top;
    ppyVar10 = yy_buffer_stack;
    if (iVar6 != -1) {
      yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[iVar8] = (char)iVar6;
      iVar6 = 1;
      pyVar9 = ppyVar10[sVar11];
      yy_n_chars = iVar6;
      pyVar9->yy_n_chars = 1;
      goto LAB_0011c13b;
    }
    pyVar9 = yy_buffer_stack[yy_buffer_stack_top];
  }
  yy_n_chars = 0;
  pyVar9->yy_n_chars = 0;
  if (iVar8 == 0) {
    yyrestart(yyin);
    pyVar9 = yy_buffer_stack[yy_buffer_stack_top];
    iVar5 = 1;
    ppyVar10 = yy_buffer_stack;
    sVar11 = yy_buffer_stack_top;
    iVar6 = yy_n_chars;
  }
  else {
    pyVar9->yy_buffer_status = 2;
    iVar5 = 2;
    iVar6 = 0;
  }
LAB_0011c13b:
  iVar8 = iVar8 + iVar6;
  if (pyVar9->yy_buf_size < iVar8) {
    iVar6 = (iVar6 >> 1) + iVar8;
    pcVar3 = (char *)realloc(pyVar9->yy_ch_buf,(long)iVar6);
    ppyVar10[sVar11]->yy_ch_buf = pcVar3;
    pcVar3 = ppyVar10[sVar11]->yy_ch_buf;
    if (pcVar3 == (char *)0x0) {
      yy_fatal_error("out of dynamic memory in yy_get_next_buffer()");
    }
    ppyVar10[sVar11]->yy_buf_size = iVar6 + -2;
  }
  else {
    pcVar3 = pyVar9->yy_ch_buf;
  }
  yy_n_chars = iVar8;
  pcVar3[iVar8] = '\0';
  ppyVar10[sVar11]->yy_ch_buf[(long)iVar8 + 1] = '\0';
  yytext = ppyVar10[sVar11]->yy_ch_buf;
  return iVar5;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}